

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glauber.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar2;
  char *pcVar3;
  typed_value<int,_char> *ptVar4;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar5;
  typed_value<boost::filesystem::path,_char> *ptVar6;
  typed_value<double,_char> *ptVar7;
  Collider *this;
  typed_value<long,_char> *ptVar8;
  options_description *poVar9;
  size_type sVar10;
  ostream *poVar11;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *pvVar12;
  undefined8 uVar13;
  required_option *anon_var_2;
  exception *e;
  Collider collider;
  ifstream ifs;
  path *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *__range2;
  OptDesc config_file_opts;
  VarMap var_map;
  string usage_str;
  OptDesc all_opts;
  OptDesc usage_opts;
  OptDesc grid_opts;
  OptDesc phys_opts;
  OptDesc output_opts;
  OptDesc general_opts;
  positional_options_description positional_opts;
  OptDesc main_opts;
  string *in_stack_ffffffffffffebc8;
  Collider *in_stack_ffffffffffffebd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebd8;
  typed_value<double,_char> *in_stack_ffffffffffffebe0;
  Collider *in_stack_ffffffffffffebf0;
  undefined7 in_stack_ffffffffffffebf8;
  undefined1 in_stack_ffffffffffffebff;
  typed_value<int,_char> *in_stack_ffffffffffffec00;
  allocator *paVar14;
  char **in_stack_ffffffffffffec30;
  undefined8 in_stack_ffffffffffffec38;
  int argc_00;
  basic_command_line_parser<char> *in_stack_ffffffffffffec40;
  basic_command_line_parser<char> *in_stack_ffffffffffffec48;
  allocator *var_map_00;
  istream local_da8 [40];
  options_description local_d80 [527];
  undefined1 local_b71;
  reference local_b30;
  path *local_b28;
  __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
  local_b20;
  allocator local_b11;
  string local_b10 [32];
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *local_af0;
  options_description local_ae8 [135];
  allocator local_a61;
  string local_a60 [39];
  allocator local_a39;
  string local_a38 [32];
  int local_a18;
  allocator local_a11;
  string local_a10 [152];
  basic_parsed_options local_978 [40];
  variables_map local_950 [167];
  allocator local_8a9;
  string local_8a8 [32];
  options_description local_888 [128];
  options_description local_808 [135];
  allocator local_781;
  string local_780 [32];
  undefined8 local_760;
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  undefined8 local_708;
  allocator local_6f9;
  string local_6f8 [32];
  undefined8 local_6d8;
  allocator local_6c9;
  string local_6c8 [32];
  options_description local_6a8 [135];
  allocator local_621;
  string local_620 [32];
  undefined8 local_600;
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [32];
  undefined8 local_5a8;
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [32];
  undefined8 local_550;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  undefined8 local_4f8;
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [32];
  undefined8 local_4a0;
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  undefined8 local_448;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [32];
  undefined8 local_3f0;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  undefined8 local_398;
  allocator local_389;
  string local_388 [32];
  undefined8 local_368;
  allocator local_359;
  string local_358 [32];
  options_description local_338 [135];
  allocator local_2b1;
  string local_2b0 [32];
  undefined8 local_290;
  allocator local_281;
  string local_280 [32];
  options_description local_260 [135];
  allocator local_1d9;
  string local_1d8 [32];
  undefined8 local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  options_description local_188 [128];
  positional_options_description local_108 [56];
  undefined4 local_d0;
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_c8;
  undefined8 local_98;
  options_description local_90 [140];
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffec38 >> 0x20);
  local_4 = 0;
  boost::program_options::options_description::options_description
            (local_90,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_98 = boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  ::required(ptVar2);
  boost::
  function1<void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>::
  function1<main::__0>(&local_c8,0);
  ptVar2 = boost::program_options::
           typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
           ::notifier((typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
                       *)in_stack_ffffffffffffebd0,
                      (function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                       *)in_stack_ffffffffffffebc8);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_98,(value_semantic *)"projectile",(char *)ptVar2);
  boost::program_options::value<int>();
  local_d0 = 1;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     (in_stack_ffffffffffffec00,
                      (int *)CONCAT17(in_stack_ffffffffffffebff,in_stack_ffffffffffffebf8));
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"number-events",(char *)ptVar4);
  boost::
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)0x152088);
  boost::program_options::positional_options_description::positional_options_description(local_108);
  pcVar3 = (char *)boost::program_options::positional_options_description::add
                             ((char *)local_108,0x18503d);
  boost::program_options::positional_options_description::add(pcVar3,0x18505b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"general options",&local_1a9);
  boost::program_options::options_description::options_description
            (local_188,local_1a8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  local_1b8 = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_1b8,"help,h");
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,"version");
  boost::program_options::
  value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"FILE",&local_1d9);
  ptVar5 = boost::program_options::
           typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
           ::value_name((typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
                         *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"config-file,c",(char *)ptVar5);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"output options",&local_281);
  boost::program_options::options_description::options_description
            (local_260,local_280,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  local_290 = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::bool_switch();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_290,(value_semantic *)"quiet,q",pcVar3);
  boost::program_options::value<boost::filesystem::path>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"PATH",&local_2b1);
  ptVar6 = boost::program_options::typed_value<boost::filesystem::path,_char>::value_name
                     ((typed_value<boost::filesystem::path,_char> *)in_stack_ffffffffffffebd0,
                      in_stack_ffffffffffffebc8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"output,o",(char *)ptVar6);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"physical options",&local_359);
  boost::program_options::options_description::options_description
            (local_338,local_358,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  local_368 = boost::program_options::options_description::add_options();
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"FLOAT",&local_389);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_398 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"0",&local_3b9);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_368,(value_semantic *)"alpha,a",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"FLOAT",&local_3e1);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_3f0 = 0x3ff0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"1",&local_411);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"fluctuation,k",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"FLOAT",&local_439);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_448 = 0x3fe0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"0.5",&local_469);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"nucleon-width,w",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"FLOAT",&local_491);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_4a0 = 0x401999999999999a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"6.4",&local_4c1);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"cross-section,x",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"FLOAT",&local_4e9);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_4f8 = 0x3ff0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"1",&local_519);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"normalization,n",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"FLOAT",&local_541);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_550 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"0",&local_571);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"b-min",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"FLOAT",&local_599);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_5a8 = 0xbff0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"auto",&local_5c9);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"b-max",(char *)ptVar7);
  this = (Collider *)boost::program_options::value<long>();
  var_map_00 = &local_5f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"INT",var_map_00);
  boost::program_options::typed_value<long,_char>::value_name
            ((typed_value<long,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_600 = 0xffffffffffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"auto",&local_621);
  ptVar8 = boost::program_options::typed_value<long,_char>::default_value
                     ((typed_value<long,_char> *)in_stack_ffffffffffffebe0,
                      (long *)in_stack_ffffffffffffebd8,(string *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"random-seed",(char *)ptVar8);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"grid options",&local_6c9);
  boost::program_options::options_description::options_description
            (local_6a8,local_6c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  local_6d8 = boost::program_options::options_description::add_options();
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"FLOAT",&local_6f9);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_708 = 0x4024000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"10.0",&local_729);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_6d8,(value_semantic *)"grid-max",(char *)ptVar7);
  boost::program_options::value<double>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"FLOAT",&local_751);
  boost::program_options::typed_value<double,_char>::value_name
            ((typed_value<double,_char> *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
  local_760 = 0x3fc999999999999a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"0.2",&local_781);
  ptVar7 = boost::program_options::typed_value<double,_char>::default_value
                     (in_stack_ffffffffffffebe0,(double *)in_stack_ffffffffffffebd8,
                      (string *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"grid-step",(char *)ptVar7);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  boost::program_options::options_description::options_description
            (local_808,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar9 = (options_description *)boost::program_options::options_description::add(local_808);
  poVar9 = (options_description *)boost::program_options::options_description::add(poVar9);
  poVar9 = (options_description *)boost::program_options::options_description::add(poVar9);
  boost::program_options::options_description::add(poVar9);
  boost::program_options::options_description::options_description
            (local_888,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar9 = (options_description *)boost::program_options::options_description::add(local_888);
  boost::program_options::options_description::add(poVar9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8a8,"usage: glauber [options] projectile projectile [number-events = 1]\n",
             &local_8a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  boost::program_options::variables_map::variables_map(local_950);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_ffffffffffffec40,argc_00,in_stack_ffffffffffffec30);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffebd0,
             (options_description *)in_stack_ffffffffffffebc8);
  boost::program_options::basic_command_line_parser<char>::positional
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffebd0,
             (positional_options_description *)in_stack_ffffffffffffebc8);
  boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffec48);
  boost::program_options::store(local_978,local_950,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x15326f);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x15327c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"help",&local_a11);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  if (sVar10 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a38,"version",&local_a39);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
    std::__cxx11::string::~string(local_a38);
    std::allocator<char>::~allocator((allocator<char> *)&local_a39);
    if (sVar10 == 0) {
      paVar14 = &local_a61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a60,"config-file",paVar14);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
      std::__cxx11::string::~string(local_a60);
      std::allocator<char>::~allocator((allocator<char> *)&local_a61);
      if (sVar10 != 0) {
        boost::program_options::options_description::options_description
                  (local_ae8,
                   (uint)boost::program_options::options_description::m_default_line_length,
                   (uint)boost::program_options::options_description::m_default_line_length >> 1);
        poVar9 = (options_description *)boost::program_options::options_description::add(local_ae8);
        poVar9 = (options_description *)boost::program_options::options_description::add(poVar9);
        poVar9 = (options_description *)boost::program_options::options_description::add(poVar9);
        boost::program_options::options_description::add(poVar9);
        paVar14 = &local_b11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b10,"config-file",paVar14);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
        pvVar12 = boost::program_options::variable_value::
                  as<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                            ((variable_value *)0x153f90);
        std::__cxx11::string::~string(local_b10);
        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        local_af0 = pvVar12;
        local_b20._M_current =
             (path *)std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                     ::begin((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                              *)in_stack_ffffffffffffebc8);
        local_b28 = (path *)std::
                            vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            ::end((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                                   *)in_stack_ffffffffffffebc8);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                              *)in_stack_ffffffffffffebd0,
                             (__normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                              *)in_stack_ffffffffffffebc8);
          if (!bVar1) break;
          local_b30 = __gnu_cxx::
                      __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                      ::operator*(&local_b20);
          bVar1 = boost::filesystem::exists((path *)in_stack_ffffffffffffebd0);
          if (!bVar1) {
            local_b71 = 1;
            uVar13 = __cxa_allocate_exception(0x10);
            boost::filesystem::path::string_abi_cxx11_(local_b30);
            std::operator+((char *)poVar9,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           paVar14);
            std::operator+(in_stack_ffffffffffffebd8,(char *)in_stack_ffffffffffffebd0);
            boost::program_options::error::error
                      ((error *)in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
            local_b71 = 0;
            __cxa_throw(uVar13,&boost::program_options::error::typeinfo,
                        boost::program_options::error::~error);
          }
          boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                    ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffebe0,
                     (path *)in_stack_ffffffffffffebd8);
          boost::program_options::parse_config_file<char>(local_da8,local_d80,SUB81(local_ae8,0));
          boost::program_options::store(local_da8,local_950,false);
          boost::program_options::basic_parsed_options<char>::~basic_parsed_options
                    ((basic_parsed_options<char> *)0x154257);
          boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
                    ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffebd0);
          __gnu_cxx::
          __normal_iterator<const_boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
          ::operator++(&local_b20);
        }
        boost::program_options::options_description::~options_description
                  ((options_description *)in_stack_ffffffffffffebd0);
      }
      boost::program_options::notify(local_950);
      glauber::Collider::Collider(this,(VarMap *)var_map_00);
      glauber::Collider::run_events(in_stack_ffffffffffffebf0);
      glauber::Collider::~Collider(in_stack_ffffffffffffebd0);
      local_a18 = 0;
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"glauber ");
      poVar11 = std::operator<<(poVar11,"1.0.0");
      std::operator<<(poVar11,'\n');
      local_4 = 0;
      local_a18 = 1;
    }
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,local_8a8);
    poVar11 = std::operator<<(poVar11,
                              "\nprojectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n")
    ;
    poVar11 = (ostream *)boost::program_options::operator<<(poVar11,local_808);
    std::operator<<(poVar11,"\nsee the online documentation for complete usage information\n");
    local_4 = 0;
    local_a18 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffebd0);
  if (local_a18 == 0) {
    local_4 = 0;
    local_a18 = 1;
  }
  std::__cxx11::string::~string(local_8a8);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)in_stack_ffffffffffffebd0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffebd0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  using namespace glauber;

  // Parse options with boost::program_options.
  // There are quite a few options, so let's separate them into logical groups.
  using OptDesc = po::options_description;

  using VecStr = std::vector<std::string>;
  OptDesc main_opts{};
  main_opts.add_options()
    ("projectile", po::value<VecStr>()->required()->
     notifier(  // use a lambda to verify there are exactly two projectiles
         [](const VecStr& projectiles) {
           if (projectiles.size() != 2)
            throw po::required_option{"projectile"};
           }),
     "projectile symbols")
    ("number-events", po::value<int>()->default_value(1),
     "number of events");

  // Make all main arguments positional.
  po::positional_options_description positional_opts{};
  positional_opts
    .add("projectile", 2)
    .add("number-events", 1);

  using VecPath = std::vector<fs::path>;
  OptDesc general_opts{"general options"};
  general_opts.add_options()
    ("help,h", "show this help message and exit")
    ("version", "print version information and exit")
    ("config-file,c", po::value<VecPath>()->value_name("FILE"),
     "configuration file\n(can be passed multiple times)");

  OptDesc output_opts{"output options"};
  output_opts.add_options()
    ("quiet,q", po::bool_switch(),
     "do not print event properties to stdout")
    ("output,o", po::value<fs::path>()->value_name("PATH"),
     "HDF5 file or directory for text files");

  OptDesc phys_opts{"physical options"};
  phys_opts.add_options()
    ("alpha,a",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "binary collision fraction")
    ("fluctuation,k",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "gamma fluctuation shape parameter")
    // ("beam-energy,e",
    //  po::value<double>()->value_name("FLOAT")->default_value(2760., "2760"),
    //  "beam energy sqrt(s) [GeV]")
    ("nucleon-width,w",
     po::value<double>()->value_name("FLOAT")->default_value(.5, "0.5"),
     "Gaussian nucleon width [fm]")
    ("cross-section,x",
     po::value<double>()->value_name("FLOAT")->default_value(6.4, "6.4"),
     "inelastic nucleon-nucleon cross section sigma_NN [fm^2]")
    ("normalization,n",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "normalization factor")
    ("b-min",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "minimum impact parameter [fm]")
    ("b-max",
     po::value<double>()->value_name("FLOAT")->default_value(-1., "auto"),
     "maximum impact parameter [fm]")
    ("random-seed",
     po::value<int64_t>()->value_name("INT")->default_value(-1, "auto"),
     "random seed");

  OptDesc grid_opts{"grid options"};
  grid_opts.add_options()
    ("grid-max",
     po::value<double>()->value_name("FLOAT")->default_value(10., "10.0"),
     "xy max [fm]\n(grid extends from -max to +max)")
    ("grid-step",
     po::value<double>()->value_name("FLOAT")->default_value(0.2, "0.2"),
     "step size [fm]");

  // Make a meta-group containing all the option groups except the main
  // positional options (don't want the auto-generated usage info for those).
  OptDesc usage_opts{};
  usage_opts
    .add(general_opts)
    .add(output_opts)
    .add(phys_opts)
    .add(grid_opts);

  // Now a meta-group containing _all_ options.
  OptDesc all_opts{};
  all_opts
    .add(usage_opts)
    .add(main_opts);

  // Will be used several times.
  const std::string usage_str{
    "usage: glauber [options] projectile projectile [number-events = 1]\n"};

  try {
    // Initialize a VarMap (boost::program_options::variables_map).
    // It will contain all configuration values.
    VarMap var_map{};

    // Parse command line options.
    po::store(po::command_line_parser(argc, argv)
        .options(all_opts).positional(positional_opts).run(), var_map);

    // Handle options that imply immediate exit.
    // Must do this _before_ po::notify() since that can throw exceptions.
    if (var_map.count("help")) {
      std::cout
        << usage_str
        << "\n"
           "projectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n"
        << usage_opts
        << "\n"
           "see the online documentation for complete usage information\n";
      return 0;
    }
    if (var_map.count("version")) {
      std::cout << "glauber " << GLAUBER_VERSION_STRING << '\n';
      return 0;
    }

    // Merge any config files.
    if (var_map.count("config-file")) {
      // Everything except general_opts.
      OptDesc config_file_opts{};
      config_file_opts
        .add(main_opts)
        .add(output_opts)
        .add(phys_opts)
        .add(grid_opts);

      for (const auto& path : var_map["config-file"].as<VecPath>()) {
        if (!fs::exists(path)) {
          throw po::error{
            "configuration file '" + path.string() + "' not found"};
        }
        fs::ifstream ifs{path};
        po::store(po::parse_config_file(ifs, config_file_opts), var_map);
      }
    }

    // Save all the final values into var_map.
    // Exceptions may occur here.
    po::notify(var_map);

    // Go!
    Collider collider{var_map};
    collider.run_events();
  }
  catch (const po::required_option&) {
    // Handle this exception separately from others.
    // This occurs e.g. when the program is excuted with no arguments.
    std::cerr << usage_str << "run 'glauber --help' for more information\n";
    return 1;
  }
  catch (const std::exception& e) {
    // For all other exceptions just output the error message.
    std::cerr << e.what() << '\n';
    return 1;
  }

  return 0;
}